

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::listTestGroupNames(TestRegistry *this,TestResult *result)

{
  byte bVar1;
  char *pcVar2;
  long *in_RSI;
  SimpleString *in_RDI;
  SimpleString gname;
  UtestShell *test;
  SimpleString groupList;
  UtestShell *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  SimpleString *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  SimpleString *pSVar3;
  SimpleString local_18;
  long *local_10;
  
  local_10 = in_RSI;
  SimpleString::SimpleString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  pSVar3 = (SimpleString *)in_RDI[1].buffer_;
  while (pSVar3 != (SimpleString *)0x0) {
    SimpleString::SimpleString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    SimpleString::operator+=
              ((SimpleString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (char *)in_stack_ffffffffffffff98);
    UtestShell::getGroup(in_stack_ffffffffffffff78);
    SimpleString::operator+=(in_stack_ffffffffffffff80,(SimpleString *)in_stack_ffffffffffffff78);
    SimpleString::~SimpleString((SimpleString *)0x21e10e);
    SimpleString::operator+=
              ((SimpleString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (char *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa7 =
         SimpleString::contains(in_stack_ffffffffffffff80,(SimpleString *)in_stack_ffffffffffffff78)
    ;
    if (!(bool)in_stack_ffffffffffffffa7) {
      SimpleString::operator+=(in_stack_ffffffffffffff80,(SimpleString *)in_stack_ffffffffffffff78);
      SimpleString::operator+=
                ((SimpleString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 (char *)in_stack_ffffffffffffff98);
    }
    SimpleString::~SimpleString((SimpleString *)0x21e1ad);
    in_stack_ffffffffffffff98 = (SimpleString *)(**(code **)(pSVar3->buffer_ + 0x18))();
    pSVar3 = in_stack_ffffffffffffff98;
  }
  SimpleString::replace((SimpleString *)0x0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SimpleString::SimpleString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  bVar1 = SimpleString::endsWith
                    (in_stack_ffffffffffffff98,
                     (SimpleString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  SimpleString::~SimpleString((SimpleString *)0x21e22c);
  if ((bVar1 & 1) != 0) {
    SimpleString::size((SimpleString *)0x21e240);
    SimpleString::subString
              (in_RDI,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (size_t)in_stack_ffffffffffffff98);
    SimpleString::operator=(in_stack_ffffffffffffff80,(SimpleString *)in_stack_ffffffffffffff78);
    SimpleString::~SimpleString((SimpleString *)0x21e27f);
  }
  pcVar2 = SimpleString::asCharString(&local_18);
  (**(code **)(*local_10 + 0x70))(local_10,pcVar2);
  SimpleString::~SimpleString((SimpleString *)0x21e2ed);
  return;
}

Assistant:

void TestRegistry::listTestGroupNames(TestResult& result)
{
    SimpleString groupList;

    for (UtestShell *test = tests_; test != NULL; test = test->getNext()) {
        SimpleString gname;
        gname += "#";
        gname += test->getGroup();
        gname += "#";

        if (!groupList.contains(gname)) {
            groupList += gname;
            groupList += " ";
        }
    }

    groupList.replace("#", "");

    if (groupList.endsWith(" "))
        groupList = groupList.subString(0, groupList.size() - 1);
    result.print(groupList.asCharString());
}